

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyImage
          (VulkanCommandBuffer *this,VkImage srcImage,VkImageLayout srcImageLayout,VkImage dstImage,
          VkImageLayout dstImageLayout,uint32_t regionCount,VkImageCopy *pRegions)

{
  string local_50;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])dstImage);
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"CopyImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x20e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    if ((this->m_State).DynamicRenderingHash != 0) {
      EndRendering(this);
    }
  }
  else {
    EndRenderPass(this);
  }
  FlushBarriers(this);
  (*vkCmdCopyImage)(this->m_VkCmdBuffer,srcImage,srcImageLayout,dstImage,dstImageLayout,regionCount,
                    pRegions);
  return;
}

Assistant:

__forceinline void CopyImage(VkImage            srcImage,
                                 VkImageLayout      srcImageLayout,
                                 VkImage            dstImage,
                                 VkImageLayout      dstImageLayout,
                                 uint32_t           regionCount,
                                 const VkImageCopy* pRegions)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyImage(m_VkCmdBuffer, srcImage, srcImageLayout, dstImage, dstImageLayout, regionCount, pRegions);
    }